

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-cg-dump.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  pointer this;
  long lVar2;
  GenericCallGraph<dg::pta::PSNode_*> *cg;
  PointerAnalysis *this_00;
  PointerGraph *this_01;
  char **in_RSI;
  uint in_EDI;
  StringRef SVar3;
  CallGraph CG_2;
  CallGraph CG_1;
  CallGraph CG;
  DGLLVMPointerAnalysis PTA;
  LLVMPointerAnalysisOptions *ptaopts;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  LLVMContext context;
  SlicerOptions options;
  LLVMPointerAnalysisOptions *in_stack_fffffffffffffc18;
  SlicerOptions *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc3f;
  LLVMPointerAnalysis *in_stack_fffffffffffffc40;
  Module *in_stack_fffffffffffffc48;
  CallGraph *in_stack_fffffffffffffc50;
  LLVMPointerAnalysisOptions *in_stack_fffffffffffffcb0;
  Module *in_stack_fffffffffffffcb8;
  DGLLVMPointerAnalysis *in_stack_fffffffffffffcc0;
  CallGraph *in_stack_fffffffffffffd00;
  size_t local_2a8;
  char local_290 [8];
  SlicerOptions local_288;
  char **local_10;
  uint local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  setupStackTraceOnError(in_EDI,in_RSI);
  parseSlicerOptions((int)&local_288 + 8,(char **)(ulong)local_8,SUB81(local_10,0),false);
  llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x16c85c);
  llvm::LLVMContext::LLVMContext((LLVMContext *)&local_288);
  parseModule(local_290,(LLVMContext *)"llvm-cg-dump",&local_288);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x16c8a2);
  if (bVar1) {
    this = std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::operator->
                     ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x16c8ce);
    llvm::StringRef::StringRef
              ((StringRef *)in_stack_fffffffffffffc20,(string *)in_stack_fffffffffffffc18);
    SVar3.Length = local_2a8;
    SVar3.Data = (char *)this;
    lVar2 = llvm::Module::getFunction(SVar3);
    if (lVar2 == 0) {
      llvm::errs();
      llvm::raw_ostream::operator<<((raw_ostream *)this,(char *)in_stack_fffffffffffffc28);
      llvm::raw_ostream::operator<<((raw_ostream *)this,in_stack_fffffffffffffc28);
      llvm::raw_ostream::operator<<((raw_ostream *)this,(char *)in_stack_fffffffffffffc28);
      local_4 = 1;
    }
    else {
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x16c980);
      if (bVar1) {
        cg = (GenericCallGraph<dg::pta::PSNode_*> *)
             std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                       ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x16c9a6);
        dg::LLVMPointerAnalysisOptions::LLVMPointerAnalysisOptions
                  ((LLVMPointerAnalysisOptions *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18
                  );
        dg::DGLLVMPointerAnalysis::DGLLVMPointerAnalysis
                  (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
        dg::LLVMPointerAnalysisOptions::~LLVMPointerAnalysisOptions
                  ((LLVMPointerAnalysisOptions *)in_stack_fffffffffffffc20);
        dg::DGLLVMPointerAnalysis::run((DGLLVMPointerAnalysis *)in_stack_fffffffffffffc20);
        bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                          ((opt_storage<bool,_false,_false> *)0x16c9fe);
        if (bVar1) {
          in_stack_fffffffffffffc20 =
               (SlicerOptions *)
               std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                         ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x16ca11);
          llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x16ca29);
          dg::llvmdg::CallGraph::CallGraph
                    (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                     (bool)in_stack_fffffffffffffc3f);
          dg::llvmdg::CallGraph::build((CallGraph *)0x16ca50);
          dumpCallGraph(in_stack_fffffffffffffd00);
          dg::llvmdg::CallGraph::~CallGraph((CallGraph *)0x16ca64);
        }
        else {
          this_00 = dg::DGLLVMPointerAnalysis::getPTA((DGLLVMPointerAnalysis *)0x16ca73);
          this_01 = dg::pta::PointerAnalysis::getPG(this_00);
          dg::pta::PointerGraph::getCallGraph(this_01);
          dg::llvmdg::CallGraph::CallGraph((CallGraph *)this,cg);
          dumpCallGraph(in_stack_fffffffffffffd00);
          dg::llvmdg::CallGraph::~CallGraph((CallGraph *)0x16caa4);
        }
        dg::DGLLVMPointerAnalysis::~DGLLVMPointerAnalysis
                  ((DGLLVMPointerAnalysis *)in_stack_fffffffffffffc20);
      }
      else {
        bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                          ((opt_storage<bool,_false,_false> *)0x16cac6);
        if (!bVar1) {
          llvm::errs();
          llvm::raw_ostream::operator<<((raw_ostream *)this,(char *)in_stack_fffffffffffffc28);
          local_4 = 1;
          goto LAB_0016cb44;
        }
        std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                  ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x16cb03);
        dg::llvmdg::CallGraph::CallGraph((CallGraph *)this,(Module *)in_stack_fffffffffffffc28);
        dg::llvmdg::CallGraph::build((CallGraph *)0x16cb1a);
        dumpCallGraph(in_stack_fffffffffffffd00);
        dg::llvmdg::CallGraph::~CallGraph((CallGraph *)0x16cb2e);
      }
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
LAB_0016cb44:
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)
             in_stack_fffffffffffffc20);
  llvm::LLVMContext::~LLVMContext((LLVMContext *)&local_288);
  SlicerOptions::~SlicerOptions(in_stack_fffffffffffffc20);
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-cg-dump", context, options);
    if (!M)
        return 1;

    if (!M->getFunction(options.dgOptions.entryFunction)) {
        llvm::errs() << "The entry function not found: "
                     << options.dgOptions.entryFunction << "\n";
        return 1;
    }

    if (usepta) {
        auto &ptaopts = options.dgOptions.PTAOptions;
#ifdef HAVE_SVF
        if (ptaopts.isSVF()) {
            SVFPointerAnalysis PTA(M.get(), ptaopts);
            PTA.run();

            llvmdg::CallGraph CG(M.get(), &PTA, lazy);
            dumpCallGraph(CG);
        } else
#endif // HAVE_SVF
        {
            DGLLVMPointerAnalysis PTA(M.get(), ptaopts);
            PTA.run();

            if (lazy) {
                llvmdg::CallGraph CG(M.get(), &PTA, lazy);
                CG.build();
                dumpCallGraph(CG);
            } else {
                // re-use the call-graph from PTA
                llvmdg::CallGraph CG(PTA.getPTA()->getPG()->getCallGraph());
                dumpCallGraph(CG);
            }
        }
    } else {
        if (!lazy) {
            llvm::errs() << "Can build CG without PTA only with -lazy option\n";
            return 1;
        }

        llvmdg::CallGraph CG(M.get());
        CG.build();
        dumpCallGraph(CG);
    }

    return 0;
}